

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O2

void ncnn::conv3x3s1_winograd43_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  float fVar5;
  float fVar6;
  int *piVar7;
  int iVar8;
  uint max_ii;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int k;
  uint uVar12;
  uint _c;
  ulong uVar13;
  float *pfVar14;
  uint max_kk;
  int kk;
  ulong uVar15;
  float *pfVar16;
  int m_1;
  long lVar17;
  undefined1 local_148 [8];
  undefined8 local_140;
  size_t local_138;
  float local_130 [2];
  undefined8 local_128;
  int local_120;
  int local_11c;
  float local_118 [4];
  size_t local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  long local_e8;
  float *local_e0;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat local_c8;
  Mat m;
  
  get_optimal_tile_mnk(outch,0,inch,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
  local_100 = (ulong)(uint)TILE_M;
  _c = (outch + TILE_M + -1) / TILE_M;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  local_f8 = (ulong)(uint)outch;
  Mat::create(&local_c8,TILE_K * TILE_M * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
  Mat::create(AT,TILE_K * TILE_M,0x24,(inch + TILE_K + -1) / TILE_K,_c,4,(Allocator *)0x0);
  if ((int)_c < 1) {
    _c = 0;
  }
  uVar12 = 0;
  while (uVar12 != _c) {
    iVar8 = get_omp_thread_num();
    m.elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    local_e0 = (float *)((long)iVar8 * local_c8.cstep * m.elemsize + (long)local_c8.data);
    m.data = local_e0;
    m.refcount = (int *)0x0;
    m.elempack = local_c8.elempack;
    m.allocator = local_c8.allocator;
    m.w = local_c8.w;
    m.h = local_c8.h;
    m.d = 1;
    m.c = local_c8.d;
    m.cstep = (m.elemsize * (long)local_c8.h * (long)local_c8.w + 0xf & 0xfffffffffffffff0) /
              m.elemsize;
    m.dims = local_c8.dims + -1;
    if (local_c8.dims == 4) {
      m.cstep = (long)local_c8.h * (long)local_c8.w;
    }
    uVar9 = (uint)local_100;
    max_ii = (int)local_f8 - uVar9 * uVar12;
    if ((int)uVar9 < (int)max_ii) {
      max_ii = uVar9;
    }
    uVar13 = 0;
    if (0 < (int)max_ii) {
      uVar13 = (ulong)max_ii;
    }
    local_f0 = (ulong)uVar12;
    local_e8 = (long)(int)uVar12;
    for (iVar8 = 0; max_kk = inch - iVar8, max_kk != 0 && iVar8 <= inch; iVar8 = iVar8 + TILE_K) {
      if (TILE_K < (int)max_kk) {
        max_kk = TILE_K;
      }
      uVar10 = 0;
      if (0 < (int)max_kk) {
        uVar10 = (ulong)max_kk;
      }
      pfVar14 = local_e0;
      for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
        pvVar4 = kernel->data;
        for (uVar15 = 0; uVar15 != uVar10; uVar15 = uVar15 + 1) {
          pfVar16 = (float *)((long)pvVar4 +
                             (uVar15 + (long)iVar8) * 0x24 +
                             (long)(int)(((int)uVar11 + uVar9 * uVar12) * inch * 9) * 4);
          for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
            fVar1 = *pfVar16;
            fVar2 = pfVar16[1];
            fVar3 = pfVar16[2];
            *(float *)(local_148 + lVar17 * 4) = fVar1;
            fVar5 = fVar2 * 0.47140452;
            fVar6 = fVar3 * 0.33333334;
            *(float *)((long)&local_140 + lVar17 * 4 + 4) = fVar1 * -0.6666667 - (fVar5 + fVar6);
            local_130[lVar17] = (fVar5 + fVar1 * -0.6666667) - fVar6;
            fVar2 = fVar2 * 0.23570226;
            *(float *)((long)&local_128 + lVar17 * 4 + 4) = fVar2 + fVar1 * 0.16666667 + fVar6;
            local_118[lVar17] = (fVar1 * 0.16666667 - fVar2) + fVar6;
            local_118[lVar17 + 3] = fVar3;
            pfVar16 = pfVar16 + 3;
          }
          for (lVar17 = 0; lVar17 != 0x48; lVar17 = lVar17 + 0xc) {
            fVar1 = *(float *)(local_148 + lVar17);
            fVar2 = *(float *)((long)&local_140 + lVar17);
            fVar3 = *(float *)(local_148 + lVar17 + 4) * 0.47140452;
            fVar5 = fVar2 * 0.33333334;
            fVar6 = *(float *)(local_148 + lVar17 + 4) * 0.23570226;
            *pfVar14 = fVar1;
            pfVar14[1] = fVar1 * -0.6666667 - (fVar3 + fVar5);
            pfVar14[2] = (fVar3 + fVar1 * -0.6666667) - fVar5;
            pfVar14[3] = fVar6 + fVar1 * 0.16666667 + fVar5;
            pfVar14[4] = (fVar1 * 0.16666667 - fVar6) + fVar5;
            pfVar14[5] = fVar2;
            pfVar14 = pfVar14 + 6;
          }
        }
      }
      local_11c = AT->w;
      local_118[0] = (float)AT->h;
      local_138 = AT->elemsize;
      local_130[0] = (float)AT->elempack;
      local_128 = AT->allocator;
      local_108 = (long)(int)local_118[0] * (long)local_11c;
      local_148 = (undefined1  [8])
                  ((long)AT->data +
                  local_138 * local_108 * (long)(iVar8 / TILE_K) + AT->cstep * local_e8 * local_138)
      ;
      local_140 = (int *)0x0;
      local_120 = 2;
      local_118[1] = 1.4013e-45;
      local_118[2] = 1.4013e-45;
      pack_A_tile(&m,(Mat *)local_148,0x24,max_ii,max_kk);
    }
    uVar12 = (int)local_f0 + 1;
  }
  piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 36;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd43_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}